

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
zeGetVirtualMemProcAddrTable(ze_api_version_t version,ze_virtual_mem_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_virtual_mem_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnReserve = driver::zeVirtualMemReserve;
      pDdiTable->pfnFree = driver::zeVirtualMemFree;
      pDdiTable->pfnQueryPageSize = driver::zeVirtualMemQueryPageSize;
      pDdiTable->pfnMap = driver::zeVirtualMemMap;
      pDdiTable->pfnUnmap = driver::zeVirtualMemUnmap;
      pDdiTable->pfnSetAccessAttribute = driver::zeVirtualMemSetAccessAttribute;
      pDdiTable->pfnGetAccessAttribute = driver::zeVirtualMemGetAccessAttribute;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetVirtualMemProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_virtual_mem_dditable_t* pDdiTable            ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnReserve                                = driver::zeVirtualMemReserve;

    pDdiTable->pfnFree                                   = driver::zeVirtualMemFree;

    pDdiTable->pfnQueryPageSize                          = driver::zeVirtualMemQueryPageSize;

    pDdiTable->pfnMap                                    = driver::zeVirtualMemMap;

    pDdiTable->pfnUnmap                                  = driver::zeVirtualMemUnmap;

    pDdiTable->pfnSetAccessAttribute                     = driver::zeVirtualMemSetAccessAttribute;

    pDdiTable->pfnGetAccessAttribute                     = driver::zeVirtualMemGetAccessAttribute;

    return result;
}